

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shmemory.cpp
# Opt level: O2

void SHMAddNamedObject(SHMPTR shmNewNamedObject)

{
  BOOL BVar1;
  LPVOID pvVar2;
  SHMPTR SVar3;
  
  pvVar2 = SHMPtrToPtr(shmNewNamedObject);
  if (pvVar2 == (LPVOID)0x0) {
    fprintf(_stderr,"] %s %s:%d","SHMAddNamedObject",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/shmemory/shmemory.cpp"
            ,0x5db);
    fprintf(_stderr,"pshmNew should not be NULL\n");
  }
  SHMLock();
  SVar3 = SHMGetInfo(SIID_NAMED_OBJECTS);
  *(SHMPTR *)((long)pvVar2 + 8) = SVar3;
  BVar1 = SHMSetInfo(SIID_NAMED_OBJECTS,shmNewNamedObject);
  if (BVar1 == 0) {
    fprintf(_stderr,"] %s %s:%d","SHMAddNamedObject",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/shmemory/shmemory.cpp"
            ,0x5e4);
    fprintf(_stderr,"Unable to add the mapping object to shared memory.\n");
  }
  SHMRelease();
  return;
}

Assistant:

void SHMAddNamedObject( SHMPTR shmNewNamedObject )
{
    PSHM_NAMED_OBJECTS pshmNew = 0;

    pshmNew = (PSHM_NAMED_OBJECTS)SHMPTR_TO_PTR( shmNewNamedObject );

    if ( pshmNew == NULL )
    {
        ASSERT( "pshmNew should not be NULL\n" );
    }

    SHMLock();

    pshmNew->ShmNext = SHMGetInfo( SIID_NAMED_OBJECTS );

    if ( !SHMSetInfo( SIID_NAMED_OBJECTS, shmNewNamedObject ) )
    {
        ASSERT( "Unable to add the mapping object to shared memory.\n" );
    }

    SHMRelease();
    return;
}